

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O0

int64_t file_seek(archive *a,void *client_data,int64_t request,wchar_t whence)

{
  uint *puVar1;
  int in_ECX;
  __off_t in_RDX;
  int *in_RSI;
  archive *in_RDI;
  int64_t r;
  read_file_data *mine;
  __off_t local_8;
  
  local_8 = lseek(*in_RSI,in_RDX,in_ECX);
  if (local_8 < 0) {
    if (in_RSI[8] == 0) {
      puVar1 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar1,"Error seeking in stdin");
    }
    else if (in_RSI[8] == 1) {
      puVar1 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar1,"Error seeking in \'%s\'",in_RSI + 9);
    }
    else {
      puVar1 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar1,"Error seeking in \'%S\'",in_RSI + 9);
    }
    local_8 = -0x1e;
  }
  return local_8;
}

Assistant:

static int64_t
file_seek(struct archive *a, void *client_data, int64_t request, int whence)
{
	struct read_file_data *mine = (struct read_file_data *)client_data;
	int64_t r;

	/* We use off_t here because lseek() is declared that way. */
	/* See above for notes about when off_t is less than 64 bits. */
	r = lseek(mine->fd, request, whence);
	if (r >= 0)
		return r;

	/* If the input is corrupted or truncated, fail. */
	if (mine->filename_type == FNT_STDIN)
		archive_set_error(a, errno, "Error seeking in stdin");
	else if (mine->filename_type == FNT_MBS)
		archive_set_error(a, errno, "Error seeking in '%s'",
		    mine->filename.m);
	else
		archive_set_error(a, errno, "Error seeking in '%S'",
		    mine->filename.w);
	return (ARCHIVE_FATAL);
}